

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

void pybind11::detail::all_type_info_add_base_most_derived_first
               (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                *bases,type_info *addl_base)

{
  int iVar1;
  const_iterator __position;
  type_info *local_20;
  
  __position._M_current =
       (bases->
       super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_20 = addl_base;
  while( true ) {
    if (__position._M_current ==
        (bases->
        super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      push_back(bases,&local_20);
      return;
    }
    iVar1 = PyType_IsSubtype(addl_base->type,(*__position._M_current)->type);
    if (iVar1 != 0) break;
    __position._M_current = __position._M_current + 1;
  }
  std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::insert
            (bases,__position,&local_20);
  return;
}

Assistant:

inline void all_type_info_add_base_most_derived_first(std::vector<type_info *> &bases,
                                                      type_info *addl_base) {
    for (auto it = bases.begin(); it != bases.end(); it++) {
        type_info *existing_base = *it;
        if (PyType_IsSubtype(addl_base->type, existing_base->type) != 0) {
            bases.insert(it, addl_base);
            return;
        }
    }
    bases.push_back(addl_base);
}